

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O0

void __thiscall
vkt::FragmentOperations::anon_unknown_0::ScissorRenderer::draw
          (ScissorRenderer *this,Context *context,Vec4 *scissorAreaFloat,VkBuffer colorBuffer)

{
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)18>_> data;
  VkAllocationCallbacks *queue_00;
  int width;
  int height;
  deUint32 dVar2;
  deUint32 dVar3;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device_00;
  Handle<(vk::HandleType)16> *pHVar4;
  Handle<(vk::HandleType)17> *pHVar5;
  Handle<(vk::HandleType)14> *pHVar6;
  VkCommandBuffer_s **ppVVar7;
  Handle<(vk::HandleType)23> *pHVar8;
  Handle<(vk::HandleType)18> *pHVar9;
  Handle<(vk::HandleType)8> *pHVar10;
  size_type sVar11;
  Handle<(vk::HandleType)9> *pHVar12;
  VkClearValue VVar13;
  VkExtent3D VVar14;
  undefined4 local_248 [2];
  VkBufferMemoryBarrier barriers_1 [1];
  deInt32 local_200;
  deInt32 dStack_1fc;
  deUint32 local_1f8;
  undefined8 local_1e0;
  VkBufferImageCopy region;
  VkImageMemoryBarrier barriers [1];
  VkDeviceSize vertexBufferOffset;
  undefined4 local_150 [2];
  VkRenderPassBeginInfo renderPassBeginInfo;
  deInt32 dStack_108;
  VkRect2D renderArea;
  VkClearValue clearValue;
  anon_unknown_0 local_e0 [16];
  Vector<int,_2> local_d0;
  VkShaderModule local_c8;
  VkShaderModule local_c0;
  VkRenderPass local_b8;
  VkPipelineLayout local_b0;
  Move<vk::Handle<(vk::HandleType)18>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_88;
  undefined1 local_68 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Vec4 *scissorAreaFloat_local;
  Context *context_local;
  ScissorRenderer *this_local;
  VkBuffer colorBuffer_local;
  
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getUniversalQueue(context);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_b0.m_internal = pHVar4->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_b8.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     (&(this->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  local_c0.m_internal = pHVar6->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     (&(this->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  local_c8.m_internal = pHVar6->m_internal;
  tcu::Vector<int,_2>::Vector(&local_d0,&this->m_renderSize);
  width = tcu::Vector<int,_2>::x(&this->m_renderSize);
  height = tcu::Vector<int,_2>::y(&this->m_renderSize);
  getAreaRect(local_e0,scissorAreaFloat,width,height);
  makeGraphicsPipeline
            (&local_a8,vk_00,device_00,local_b0,local_b8,local_c0,local_c8,&local_d0,
             (IVec4 *)local_e0,this->m_topology);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface._0_4_ = (int)local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_88.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_88.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_88.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_88.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_68,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_a8);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  beginCommandBuffer(vk_00,*ppVVar7);
  VVar13 = ::vk::makeClearValueColor(&this->m_clearColor);
  renderArea.extent = (VkExtent2D)VVar13.depthStencil;
  register0x00000000 = ::vk::makeOffset2D(0,0);
  dVar2 = tcu::Vector<int,_2>::x(&this->m_renderSize);
  dVar3 = tcu::Vector<int,_2>::y(&this->m_renderSize);
  renderArea.offset = (VkOffset2D)::vk::makeExtent2D(dVar2,dVar3);
  local_150[0] = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPassBeginInfo.pNext = (void *)pHVar5->m_internal;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  renderPassBeginInfo.renderPass.m_internal = pHVar8->m_internal;
  renderPassBeginInfo.framebuffer.m_internal._0_4_ = renderPassBeginInfo.pClearValues._4_4_;
  renderPassBeginInfo.framebuffer.m_internal._4_4_ = dStack_108;
  renderPassBeginInfo.renderArea.offset = renderArea.offset;
  renderPassBeginInfo.renderArea.extent.width = 1;
  renderPassBeginInfo._48_8_ = &renderArea.extent;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x74])(vk_00,*ppVVar7,local_150,0);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar7;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_68);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,0,pHVar9->m_internal);
  barriers[0].subresourceRange.layerCount = 0;
  barriers[0]._68_4_ = 0;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar7;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                      (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (*vk_00->_vptr_DeviceInterface[0x58])
            (vk_00,pVVar1,0,1,pHVar10,&barriers[0].subresourceRange.layerCount);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar7;
  sVar11 = std::
           vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
           ::size(&this->m_vertices);
  (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,pVVar1,sVar11 & 0xffffffff,1,0);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x76])(vk_00,*ppVVar7);
  region.imageExtent.height = 0x2d;
  barriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barriers[0]._4_4_ = 0;
  barriers[0].pNext._0_4_ = 0x100;
  barriers[0].pNext._4_4_ = 0x800;
  barriers[0].srcAccessMask = 2;
  barriers[0].dstAccessMask = 6;
  barriers[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  barriers[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  barriers[0]._32_8_ = pHVar12->m_internal;
  barriers[0].subresourceRange.levelCount = (this->m_colorSubresourceRange).layerCount;
  barriers[0].image.m_internal._0_4_ = (this->m_colorSubresourceRange).aspectMask;
  barriers[0].image.m_internal._4_4_ = (this->m_colorSubresourceRange).baseMipLevel;
  barriers[0].subresourceRange.aspectMask = (this->m_colorSubresourceRange).levelCount;
  barriers[0].subresourceRange.baseMipLevel = (this->m_colorSubresourceRange).baseArrayLayer;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar7,0x400,0x1000,0,0,0,0,0,1,&region.imageExtent.height);
  local_1e0 = 0;
  region.bufferOffset._0_4_ = 0;
  region.bufferOffset._4_4_ = 0;
  region._8_16_ = ::vk::makeImageSubresourceLayers(1,0,0,1);
  region._24_12_ = ::vk::makeOffset3D(0,0,0);
  dVar2 = tcu::Vector<int,_2>::x(&this->m_renderSize);
  dVar3 = tcu::Vector<int,_2>::y(&this->m_renderSize);
  VVar14 = ::vk::makeExtent3D(dVar2,dVar3,1);
  local_1f8 = VVar14.depth;
  region.imageExtent.width = local_1f8;
  _local_200 = VVar14._0_8_;
  region.imageOffset.y = local_200;
  region.imageOffset.z = dStack_1fc;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar7;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  barriers_1[0].size = colorBuffer.m_internal;
  (*vk_00->_vptr_DeviceInterface[99])
            (vk_00,pVVar1,pHVar12->m_internal,6,colorBuffer.m_internal,1,&local_1e0);
  local_248[0] = 0x2c;
  barriers_1[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barriers_1[0]._4_4_ = 0;
  barriers_1[0].pNext._0_4_ = 0x1000;
  barriers_1[0].pNext._4_4_ = 0x2000;
  barriers_1[0].srcAccessMask = 0xffffffff;
  barriers_1[0].dstAccessMask = 0xffffffff;
  barriers_1[0].buffer.m_internal = 0;
  barriers_1[0].offset = 0xffffffffffffffff;
  barriers_1[0]._24_8_ = colorBuffer.m_internal;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar7,0x1000,0x4000,0,0,0,1,local_248,0,0);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  result = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar7);
  ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorTests.cpp"
                    ,0x29a);
  queue_00 = pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  submitCommandsAndWait(vk_00,device_00,(VkQueue)queue_00,*ppVVar7);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_68);
  return;
}

Assistant:

void draw (Context& context, const Vec4& scissorAreaFloat, const VkBuffer colorBuffer) const
	{
		const DeviceInterface&		vk			= context.getDeviceInterface();
		const VkDevice				device		= context.getDevice();
		const VkQueue				queue		= context.getUniversalQueue();

		// New pipeline, because we're modifying scissor (we don't use dynamic state).
		const Unique<VkPipeline>	pipeline	(makeGraphicsPipeline(vk, device, *m_pipelineLayout, *m_renderPass, *m_vertexModule, *m_fragmentModule,
												 m_renderSize, getAreaRect(scissorAreaFloat, m_renderSize.x(), m_renderSize.y()), m_topology));

		beginCommandBuffer(vk, *m_cmdBuffer);

		const VkClearValue			clearValue	= makeClearValueColor(m_clearColor);
		const VkRect2D				renderArea	=
		{
			makeOffset2D(0, 0),
			makeExtent2D(m_renderSize.x(), m_renderSize.y()),
		};
		const VkRenderPassBeginInfo renderPassBeginInfo =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
			DE_NULL,										// const void*             pNext;
			*m_renderPass,									// VkRenderPass            renderPass;
			*m_framebuffer,									// VkFramebuffer           framebuffer;
			renderArea,										// VkRect2D                renderArea;
			1u,												// uint32_t                clearValueCount;
			&clearValue,									// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_vertices.size()), 1u, 0u, 0u);
		vk.cmdEndRenderPass(*m_cmdBuffer);

		// Prepare color image for copy
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_TRANSFER_READ_BIT,								// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*m_colorImage,												// VkImage					image;
					m_colorSubresourceRange,									// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		// Color image -> host buffer
		{
			const VkBufferImageCopy region =
			{
				0ull,																		// VkDeviceSize                bufferOffset;
				0u,																			// uint32_t                    bufferRowLength;
				0u,																			// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u),			// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),														// VkOffset3D                  imageOffset;
				makeExtent3D(m_renderSize.x(), m_renderSize.y(), 1u),						// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*m_cmdBuffer, *m_colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, colorBuffer, 1u, &region);
		}
		// Buffer write barrier
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
					DE_NULL,										// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
					colorBuffer,									// VkBuffer           buffer;
					0ull,											// VkDeviceSize       offset;
					VK_WHOLE_SIZE,									// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
		}

		VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);
	}